

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void ShowExampleAppSimpleOverlay(bool *p_open)

{
  bool bVar1;
  undefined1 *in_RDI;
  ImVec2 window_pos_pivot;
  ImVec2 window_pos;
  ImGuiWindowFlags window_flags;
  ImGuiIO *io;
  float DISTANCE;
  bool in_stack_0000006e;
  bool in_stack_0000006f;
  char *in_stack_00000070;
  char *in_stack_00000078;
  ImGuiWindowFlags in_stack_00000364;
  bool *in_stack_00000368;
  char *in_stack_00000370;
  float in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  float in_stack_ffffffffffffffc4;
  float local_38;
  float local_30;
  ImVec2 local_2c;
  ImVec2 local_24;
  undefined4 local_1c;
  ImGuiIO *local_18;
  undefined4 local_c;
  undefined1 *local_8;
  
  local_c = 0x41200000;
  local_8 = in_RDI;
  local_18 = ImGui::GetIO();
  local_1c = 0xc116b;
  if (ShowExampleAppSimpleOverlay::corner != -1) {
    local_1c = 0xc116f;
    if ((ShowExampleAppSimpleOverlay::corner & 1U) == 0) {
      local_30 = 10.0;
    }
    else {
      local_30 = (local_18->DisplaySize).x - 10.0;
    }
    if ((ShowExampleAppSimpleOverlay::corner & 2U) == 0) {
      local_38 = 10.0;
    }
    else {
      local_38 = (local_18->DisplaySize).y - 10.0;
    }
    ImVec2::ImVec2(&local_24,local_30,local_38);
    in_stack_ffffffffffffffc0 = 0;
    in_stack_ffffffffffffffc4 = 1.0;
    if ((ShowExampleAppSimpleOverlay::corner & 1U) == 0) {
      in_stack_ffffffffffffffc4 = 0.0;
    }
    in_stack_ffffffffffffffbc = 1.0;
    if ((ShowExampleAppSimpleOverlay::corner & 2U) == 0) {
      in_stack_ffffffffffffffbc = 0.0;
    }
    ImVec2::ImVec2(&local_2c,in_stack_ffffffffffffffc4,in_stack_ffffffffffffffbc);
    ImGui::SetNextWindowPos(&local_24,1,&local_2c);
  }
  ImGui::SetNextWindowBgAlpha(0.35);
  bVar1 = ImGui::Begin(in_stack_00000370,in_stack_00000368,in_stack_00000364);
  if (bVar1) {
    ImGui::Text("Simple overlay\nin the corner of the screen.\n(right-click to change position)");
    ImGui::Separator();
    bVar1 = ImGui::IsMousePosValid((ImVec2 *)0x0);
    if (bVar1) {
      ImGui::Text((char *)(double)(local_18->MousePos).x,(double)(local_18->MousePos).y,
                  "Mouse Position: (%.1f,%.1f)");
    }
    else {
      ImGui::Text("Mouse Position: <invalid>");
    }
    bVar1 = ImGui::BeginPopupContextWindow
                      ((char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       (ImGuiPopupFlags)in_stack_ffffffffffffffbc);
    if (bVar1) {
      bVar1 = ImGui::MenuItem(in_stack_00000078,in_stack_00000070,in_stack_0000006f,
                              in_stack_0000006e);
      if (bVar1) {
        ShowExampleAppSimpleOverlay::corner = -1;
      }
      bVar1 = ImGui::MenuItem(in_stack_00000078,in_stack_00000070,in_stack_0000006f,
                              in_stack_0000006e);
      if (bVar1) {
        ShowExampleAppSimpleOverlay::corner = 0;
      }
      bVar1 = ImGui::MenuItem(in_stack_00000078,in_stack_00000070,in_stack_0000006f,
                              in_stack_0000006e);
      if (bVar1) {
        ShowExampleAppSimpleOverlay::corner = 1;
      }
      bVar1 = ImGui::MenuItem(in_stack_00000078,in_stack_00000070,in_stack_0000006f,
                              in_stack_0000006e);
      if (bVar1) {
        ShowExampleAppSimpleOverlay::corner = 2;
      }
      bVar1 = ImGui::MenuItem(in_stack_00000078,in_stack_00000070,in_stack_0000006f,
                              in_stack_0000006e);
      if (bVar1) {
        ShowExampleAppSimpleOverlay::corner = 3;
      }
      if ((local_8 != (undefined1 *)0x0) &&
         (bVar1 = ImGui::MenuItem(in_stack_00000078,in_stack_00000070,in_stack_0000006f,
                                  in_stack_0000006e), bVar1)) {
        *local_8 = 0;
      }
      ImGui::EndPopup();
    }
  }
  ImGui::End();
  return;
}

Assistant:

static void ShowExampleAppSimpleOverlay(bool* p_open)
{
    const float DISTANCE = 10.0f;
    static int corner = 0;
    ImGuiIO& io = ImGui::GetIO();
    ImGuiWindowFlags window_flags = ImGuiWindowFlags_NoDecoration | ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_NoFocusOnAppearing | ImGuiWindowFlags_NoNav;
    if (corner != -1)
    {
        window_flags |= ImGuiWindowFlags_NoMove;
        ImVec2 window_pos = ImVec2((corner & 1) ? io.DisplaySize.x - DISTANCE : DISTANCE, (corner & 2) ? io.DisplaySize.y - DISTANCE : DISTANCE);
        ImVec2 window_pos_pivot = ImVec2((corner & 1) ? 1.0f : 0.0f, (corner & 2) ? 1.0f : 0.0f);
        ImGui::SetNextWindowPos(window_pos, ImGuiCond_Always, window_pos_pivot);
    }
    ImGui::SetNextWindowBgAlpha(0.35f); // Transparent background
    if (ImGui::Begin("Example: Simple overlay", p_open, window_flags))
    {
        ImGui::Text("Simple overlay\n" "in the corner of the screen.\n" "(right-click to change position)");
        ImGui::Separator();
        if (ImGui::IsMousePosValid())
            ImGui::Text("Mouse Position: (%.1f,%.1f)", io.MousePos.x, io.MousePos.y);
        else
            ImGui::Text("Mouse Position: <invalid>");
        if (ImGui::BeginPopupContextWindow())
        {
            if (ImGui::MenuItem("Custom",       NULL, corner == -1)) corner = -1;
            if (ImGui::MenuItem("Top-left",     NULL, corner == 0)) corner = 0;
            if (ImGui::MenuItem("Top-right",    NULL, corner == 1)) corner = 1;
            if (ImGui::MenuItem("Bottom-left",  NULL, corner == 2)) corner = 2;
            if (ImGui::MenuItem("Bottom-right", NULL, corner == 3)) corner = 3;
            if (p_open && ImGui::MenuItem("Close")) *p_open = false;
            ImGui::EndPopup();
        }
    }
    ImGui::End();
}